

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w,uint32_t h)

{
  pointer piVar1;
  pointer peVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar1 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  uVar5 = (ulong)h % (uVar6 & 0xffffffff);
  iVar4 = (int)uVar5;
  iVar3 = piVar1[iVar4];
  if (iVar3 != -1) {
    peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __s2 = (w->_M_dataplus)._M_p;
    __n = w->_M_string_length;
    do {
      iVar4 = (int)uVar5;
      if (peVar2[iVar3].word._M_string_length == __n) {
        if (__n == 0) {
          return iVar4;
        }
        iVar3 = bcmp(peVar2[iVar3].word._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) {
          return iVar4;
        }
      }
      uVar5 = (long)(iVar4 + 1) % (long)(int)uVar6;
      iVar4 = (int)uVar5;
      uVar5 = uVar5 & 0xffffffff;
      iVar3 = piVar1[iVar4];
    } while (iVar3 != -1);
  }
  return iVar4;
}

Assistant:

int32_t Dictionary::find(const std::string& w, uint32_t h) const {
  int32_t word2intsize = word2int_.size();
  int32_t id = h % word2intsize;
  while (word2int_[id] != -1 && words_[word2int_[id]].word != w) {
    id = (id + 1) % word2intsize;
  }
  return id;
}